

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O1

void telnet_send_vzmpv(telnet_t *telnet,__va_list_tag *va)

{
  uint uVar1;
  char *__s;
  undefined8 *puVar2;
  size_t sVar3;
  uchar sb [3];
  char local_4b [3];
  telnet_event_t local_48;
  
  local_4b[0] = -1;
  local_4b[1] = -6;
  local_4b[2] = 0x5d;
  local_48.type = TELNET_EV_SEND;
  local_48.data.size = 3;
  local_48.data.buffer = local_4b;
  (*telnet->eh)(telnet,&local_48,telnet->ud);
  while( true ) {
    uVar1 = va->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar2 = (undefined8 *)((ulong)uVar1 + (long)va->reg_save_area);
      va->gp_offset = uVar1 + 8;
    }
    else {
      puVar2 = (undefined8 *)va->overflow_arg_area;
      va->overflow_arg_area = puVar2 + 1;
    }
    __s = (char *)*puVar2;
    if (__s == (char *)0x0) break;
    sVar3 = strlen(__s);
    telnet_send(telnet,__s,sVar3 + 1);
  }
  local_4b[0] = -1;
  local_4b[1] = -0x10;
  local_48.type = TELNET_EV_SEND;
  local_48.data.size = 2;
  local_48.data.buffer = local_4b;
  (*telnet->eh)(telnet,&local_48,telnet->ud);
  return;
}

Assistant:

void telnet_send_vzmpv(telnet_t *telnet, va_list va) {
	const char* arg;

	/* ZMP header */
	telnet_begin_sb(telnet, TELNET_TELOPT_ZMP);

	/* send out each argument, including trailing NUL byte */
	while ((arg = va_arg(va, const char *)) != 0)
		telnet_zmp_arg(telnet, arg);

	/* ZMP footer */
	telnet_finish_zmp(telnet);
}